

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O0

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  CoeffReturnType pdVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar4;
  ostream *poVar5;
  double dVar6;
  double dVar7;
  __type _Var8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_340;
  undefined1 local_320 [8];
  VectorXd z;
  invalid_argument e;
  MatrixXd local_300;
  double local_2e8;
  Scalar local_2e0;
  double local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  double local_2c0;
  Scalar local_2b8;
  double local_2b0;
  double local_2a8;
  Scalar local_2a0;
  double local_298;
  Scalar local_290;
  Scalar local_288;
  double local_280;
  Scalar local_278;
  double local_270;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_268;
  int local_248 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_240;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  Scalar local_210;
  Scalar local_208;
  Scalar local_200;
  Scalar local_1f8;
  Scalar local_1f0;
  double local_1e8;
  Scalar local_1e0;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  double local_1c0;
  Scalar local_1b8;
  Scalar local_1b0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1a8;
  float local_184;
  Scalar SStack_180;
  float dt;
  Scalar local_178;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_170;
  Scalar local_150;
  Scalar local_148;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_140;
  undefined1 local_120 [8];
  VectorXd cartesian_measurement;
  double y;
  double x;
  double ro_dot;
  double theta;
  double ro;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_68;
  int local_38 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_30;
  MeasurementPackage *local_18;
  MeasurementPackage *measurement_pack_local;
  FusionEKF *this_local;
  
  local_18 = measurement_pack;
  measurement_pack_local = (MeasurementPackage *)this;
  if ((this->is_initialized_ & 1U) == 0) {
    local_38[1] = 4;
    local_38[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_30,local_38 + 1,local_38);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).P_,&local_30);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_30);
    local_70 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_68,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).P_,
               &local_70);
    local_78 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_68,&local_78);
    local_80 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_80);
    local_88 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_88);
    local_90 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_90);
    local_98 = 1.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_98);
    local_a0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a0);
    local_a8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a8);
    local_b0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b0);
    local_b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b8);
    local_c0 = 1000.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c0);
    local_c8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c8);
    local_d0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_d0);
    local_d8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_d8);
    local_e0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_e0);
    ro = 1000.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&ro);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_68)
    ;
    if (local_18->sensor_type_ == RADAR) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      theta = *pdVar3;
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      ro_dot = *pdVar3;
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,2);
      dVar7 = theta;
      x = *pdVar3;
      dVar6 = cos(ro_dot);
      dVar1 = theta;
      y = dVar7 * dVar6;
      dVar7 = sin(ro_dot);
      cartesian_measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows = (DenseIndex)(dVar1 * dVar7);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_120,4)
      ;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_140,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_120,&y);
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_140,
                          (Scalar *)
                          &cartesian_measurement.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows);
      local_148 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar4,&local_148);
      local_150 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar4,&local_150)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_140);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (&(this->ekf_).x_,(Matrix<double,__1,_1,_0,__1,_1> *)local_120);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_120);
    }
    else if (local_18->sensor_type_ == LASER) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_170,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->ekf_).x_,
                 pdVar3);
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_170,pdVar3);
      local_178 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (pCVar4,&local_178);
      SStack_180 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar4,&stack0xfffffffffffffe80);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_170);
    }
    this->previous_timestamp_ = local_18->timestamp_;
    this->is_initialized_ = true;
  }
  else {
    local_184 = (float)((double)(measurement_pack->timestamp_ - this->previous_timestamp_) /
                       1000000.0);
    this->previous_timestamp_ = measurement_pack->timestamp_;
    local_1b0 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_1a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).F_,
               &local_1b0);
    local_1b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_1a8,&local_1b8);
    local_1c0 = (double)local_184;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1c0);
    local_1c8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1c8);
    local_1d0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1d0);
    local_1d8 = 1.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1d8);
    local_1e0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1e0);
    local_1e8 = (double)local_184;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1e8);
    local_1f0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1f0);
    local_1f8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_1f8);
    local_200 = 1.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_200);
    local_208 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_208);
    local_210 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_210);
    local_218 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_218);
    local_220 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_220);
    local_228 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_228)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_1a8);
    local_248[1] = 4;
    local_248[0] = 4;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_240,local_248 + 1,local_248);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).Q_,&local_240);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_240);
    _Var8 = std::pow<float,int>(local_184,4);
    local_270 = _Var8 * 0.25 * (double)this->noise_ax;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_268,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->ekf_).Q_,
               &local_270);
    local_278 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_268,&local_278);
    _Var8 = std::pow<float,int>(local_184,3);
    local_280 = _Var8 * 0.5 * (double)this->noise_ax;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_280);
    local_288 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_288);
    local_290 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_290);
    _Var8 = std::pow<float,int>(local_184,4);
    local_298 = _Var8 * 0.25 * (double)this->noise_ay;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_298);
    local_2a0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2a0);
    _Var8 = std::pow<float,int>(local_184,3);
    local_2a8 = _Var8 * 0.5 * (double)this->noise_ay;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2a8);
    _Var8 = std::pow<float,int>(local_184,3);
    local_2b0 = _Var8 * 0.5 * (double)this->noise_ax;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2b0);
    local_2b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2b8);
    _Var8 = std::pow<float,int>(local_184,2);
    local_2c0 = _Var8 * (double)this->noise_ax;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2c0);
    local_2c8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2c8);
    local_2d0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2d0);
    _Var8 = std::pow<float,int>(local_184,3);
    local_2d8 = _Var8 * 0.5 * (double)this->noise_ay;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2d8);
    local_2e0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_2e0);
    _Var8 = std::pow<float,int>(local_184,2);
    local_2e8 = _Var8 * (double)this->noise_ay;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_2e8)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
              (&local_268);
    KalmanFilter::Predict(&this->ekf_);
    if (local_18->sensor_type_ == RADAR) {
      Tools::CalculateJacobian(&local_300,&this->tools,&(this->ekf_).x_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->Hj_,&local_300);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_300);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->Hj_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_radar_);
      KalmanFilter::UpdateEKF(&this->ekf_,&local_18->raw_measurements_);
    }
    else {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).H_,&this->H_laser_);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->ekf_).R_,&this->R_laser_);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_320,2)
      ;
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_340,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_320,pdVar3);
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &local_18->raw_measurements_,1);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(&local_340,pdVar3)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_340);
      KalmanFilter::Update(&this->ekf_,(VectorXd *)local_320);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_320);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"x_ = ");
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &(this->ekf_).x_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"P_ = ");
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      &(this->ekf_).P_);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {
  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {

    //state covariance matrix P
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      //Convert radar from polar to cartesian coordinates and initialize state.
      double ro = measurement_pack.raw_measurements_[0];
      double theta = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      double x = ro * std::cos(theta);
      double y = ro * std::sin(theta);

      VectorXd cartesian_measurement = VectorXd(4);
      cartesian_measurement << x, y, 0, 0;

      ekf_.x_ = cartesian_measurement;
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      //Initialize state.
      ekf_.x_ << measurement_pack.raw_measurements_[0],
          measurement_pack.raw_measurements_[1],
          0,
          0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;
  previous_timestamp_ = measurement_pack.timestamp_;

  // Modify the F matrix so that the time is integrated
  ekf_.F_ << 1, 0, dt, 0,
            0, 1, 0, dt,
            0, 0, 1, 0,
            0, 0, 0, 1;

  // Set the process covariance matrix Q
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ <<  (pow(dt, 4)/4)*noise_ax, 0, (pow(dt, 3)/2)*noise_ax, 0,
          0, (pow(dt, 4)/4)*noise_ay, 0, (pow(dt, 3)/2)*noise_ay,
          (pow(dt, 3)/2)*noise_ax, 0, (pow(dt, 2))*noise_ax, 0,
          0, (pow(dt, 3)/2)*noise_ay, 0, (pow(dt, 2))*noise_ay;

  // Call the Kalman Filter predict() function
  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    try {
      // Radar updates
      Hj_ = tools.CalculateJacobian(ekf_.x_);
      ekf_.H_ = Hj_;
      ekf_.R_ = R_radar_;
      ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    } catch (std::invalid_argument e) {
      cout << "Exception in radar update: " << e.what() << '\n';
    }
  } else {
    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    VectorXd z(2);
    z << measurement_pack.raw_measurements_[0],
        measurement_pack.raw_measurements_[1];
    ekf_.Update(z);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}